

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.hpp
# Opt level: O1

void __thiscall
ROM::Description::
Description<std::initializer_list<std::__cxx11::string>,std::initializer_list<unsigned_int>>
          (Description *this,Name name,string machine_name,string descriptive_name,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          file_names,size_t size,initializer_list<unsigned_int> crc32s)

{
  pointer pcVar1;
  long lVar2;
  size_type in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_43;
  less<unsigned_int> local_42;
  allocator_type local_41;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  this->name = name;
  local_38 = &this->machine_name;
  local_40 = &(this->machine_name).field_2;
  (this->machine_name)._M_dataplus._M_p = (pointer)local_40;
  pcVar1 = ((file_names._M_array)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (file_names._M_array)->_M_string_length);
  (this->descriptive_name)._M_dataplus._M_p = (pointer)&(this->descriptive_name).field_2;
  lVar2 = *(long *)file_names._M_len;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->descriptive_name,lVar2,((long *)file_names._M_len)[1] + lVar2);
  __l._M_len = in_R9;
  __l._M_array = (iterator)size;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->file_names,__l,&local_41);
  this->size = (size_t)machine_name._M_dataplus._M_p;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->crc32s,(initializer_list<unsigned_int>)machine_name._8_16_,&local_42,&local_43);
  if (((this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) &&
     ((this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color == _S_red)) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(this->crc32s)._M_t);
  }
  return;
}

Assistant:

Description(
			Name name, std::string machine_name, std::string descriptive_name, FileNameT file_names, size_t size, CRC32T crc32s = uint32_t(0)
		) : name{name}, machine_name{machine_name}, descriptive_name{descriptive_name}, file_names{file_names}, size{size}, crc32s{crc32s} {
			// Slightly lazy: deal with the case where the constructor wasn't provided with any
			// CRCs by spotting that the set has exactly one member, which has value 0. The alternative
			// would be to provide a partial specialisation that never put anything into the set.
			if(this->crc32s.size() == 1 && !*this->crc32s.begin()) {
				this->crc32s.clear();
			}
		}